

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio_test.h
# Opt level: O1

void pair(native_type *fds)

{
  int __fd;
  int iVar1;
  long *plVar2;
  socklen_t len;
  int yes;
  sockaddr addr;
  sockaddr_in inaddr;
  socklen_t local_40 [2];
  sockaddr local_38;
  sockaddr local_28;
  
  __fd = socket(2,1,6);
  if (__fd < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"int(lst) >= 0",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x33);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    return_code = 1;
  }
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  local_38.sa_family = 0;
  local_38.sa_data[0] = '\0';
  local_38.sa_data[1] = '\0';
  local_38.sa_data[2] = '\0';
  local_38.sa_data[3] = '\0';
  local_38.sa_data[4] = '\0';
  local_38.sa_data[5] = '\0';
  local_38.sa_data[6] = '\0';
  local_38.sa_data[7] = '\0';
  local_38.sa_data[8] = '\0';
  local_38.sa_data[9] = '\0';
  local_38.sa_data[10] = '\0';
  local_38.sa_data[0xb] = '\0';
  local_38.sa_data[0xc] = '\0';
  local_38.sa_data[0xd] = '\0';
  local_28.sa_family = 2;
  local_28.sa_data[0] = '\0';
  local_28.sa_data[1] = '\0';
  local_28.sa_data[2] = '\x7f';
  local_28.sa_data[3] = '\0';
  local_28.sa_data[4] = '\0';
  local_28.sa_data[5] = '\x01';
  local_40[1] = 1;
  iVar1 = setsockopt(__fd,1,2,local_40 + 1,4);
  if (iVar1 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"int(setsockopt(lst,1,2,(char*)&yes,sizeof(yes))) >= 0",0x35);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x3a);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    return_code = 1;
  }
  iVar1 = bind(__fd,&local_28,0x10);
  if (iVar1 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"int(bind(lst,(struct sockaddr *)&inaddr,sizeof(inaddr))) >= 0"
               ,0x3d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x3b);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    return_code = 1;
  }
  listen(__fd,1);
  local_40[0] = 0x10;
  iVar1 = getsockname(__fd,&local_38,local_40);
  if (iVar1 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"int(getsockname(lst, &addr,&len)) >= 0",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x43);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    return_code = 1;
  }
  iVar1 = socket(2,1,0);
  *fds = iVar1;
  if (iVar1 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"int(fds[0]) >= 0",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x45);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    return_code = 1;
  }
  iVar1 = connect(*fds,&local_38,local_40[0]);
  if (iVar1 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"int(connect(fds[0],&addr,len)) >= 0",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x46);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    return_code = 1;
  }
  iVar1 = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0);
  fds[1] = iVar1;
  if (iVar1 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"int(fds[1]) >= 0",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x48);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    return_code = 1;
  }
  close(__fd);
  return;
}

Assistant:

inline void pair(booster::aio::native_type fds[2])
{
	using namespace booster::aio;
	struct sockaddr_in inaddr;
	struct sockaddr addr;
	native_type lst=::socket(AF_INET, SOCK_STREAM,IPPROTO_TCP);
	check(lst);
	memset(&inaddr, 0, sizeof(inaddr));
	memset(&addr, 0, sizeof(addr));
	inaddr.sin_family = AF_INET;
	inaddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
	inaddr.sin_port = 0;
	int yes=1;
	check(setsockopt(lst,SOL_SOCKET,SO_REUSEADDR,(char*)&yes,sizeof(yes)));
	check(bind(lst,(struct sockaddr *)&inaddr,sizeof(inaddr)));
	listen(lst,1);
#ifdef BOOSTER_WIN32
	int
#else
	socklen_t 
#endif
	len=sizeof(inaddr);
	check(getsockname(lst, &addr,&len));
	fds[0]=::socket(AF_INET, SOCK_STREAM,0);
	check(fds[0]);
	check(connect(fds[0],&addr,len));
	fds[1]=accept(lst,0,0);
	check(fds[1]);
	closefd(lst);
}